

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::HttpServer::Connection::LoopResult> * __thiscall
kj::_::ExceptionOr<kj::HttpServer::Connection::LoopResult>::operator=
          (ExceptionOr<kj::HttpServer::Connection::LoopResult> *this,
          ExceptionOr<kj::HttpServer::Connection::LoopResult> *param_1)

{
  ExceptionOr<kj::HttpServer::Connection::LoopResult> *param_1_local;
  ExceptionOr<kj::HttpServer::Connection::LoopResult> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::HttpServer::Connection::LoopResult>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;